

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

xml_node __thiscall pugi::xml_node::prepend_move(xml_node *this,xml_node *moved)

{
  bool bVar1;
  xml_allocator *this_00;
  xml_document_struct *pxVar2;
  undefined8 *in_RSI;
  xml_node in_RDI;
  xml_allocator *alloc;
  xml_node in_stack_fffffffffffffff8;
  
  bVar1 = impl::anon_unknown_0::allow_move(in_stack_fffffffffffffff8,in_RDI);
  if (bVar1) {
    this_00 = impl::anon_unknown_0::get_allocator<pugi::xml_node_struct>
                        ((xml_node_struct *)(in_RDI._root)->header);
    bVar1 = impl::anon_unknown_0::xml_allocator::reserve(this_00);
    if (bVar1) {
      pxVar2 = impl::anon_unknown_0::get_document<pugi::xml_node_struct>
                         ((xml_node_struct *)(in_RDI._root)->header);
      (pxVar2->super_xml_node_struct).header = (pxVar2->super_xml_node_struct).header | 0x40;
      impl::anon_unknown_0::remove_node((xml_node_struct *)*in_RSI);
      impl::anon_unknown_0::prepend_node
                ((xml_node_struct *)*in_RSI,(xml_node_struct *)(in_RDI._root)->header);
      in_stack_fffffffffffffff8._root = (xml_node_struct *)*in_RSI;
    }
    else {
      xml_node((xml_node *)&stack0xfffffffffffffff8);
    }
  }
  else {
    xml_node((xml_node *)&stack0xfffffffffffffff8);
  }
  return (xml_node)in_stack_fffffffffffffff8._root;
}

Assistant:

PUGI_IMPL_FN xml_node xml_node::prepend_move(const xml_node& moved)
	{
		if (!impl::allow_move(*this, moved)) return xml_node();

		impl::xml_allocator& alloc = impl::get_allocator(_root);
		if (!alloc.reserve()) return xml_node();

		// disable document_buffer_order optimization since moving nodes around changes document order without changing buffer pointers
		impl::get_document(_root).header |= impl::xml_memory_page_contents_shared_mask;

		impl::remove_node(moved._root);
		impl::prepend_node(moved._root, _root);

		return moved;
	}